

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool print_number(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  long lVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  cJSON_bool cVar7;
  ulong uVar8;
  uchar uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  double test;
  uchar number_buffer [26];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = item->valuedouble;
  uVar3 = get_decimal_point();
  cVar7 = 0;
  if (output_buffer == (printbuffer *)0x0) goto LAB_00105823;
  if ((dVar1 * 0.0 != 0.0) || (NAN(dVar1 * 0.0))) {
    builtin_memcpy(number_buffer,"null",5);
    uVar4 = 4;
  }
  else {
    uVar4 = sprintf((char *)number_buffer,"%1.15g");
    iVar5 = __isoc99_sscanf(number_buffer,"%lg",&test);
    if (iVar5 == 1) {
      if ((test != dVar1) || (NAN(test) || NAN(dVar1))) goto LAB_001057c2;
    }
    else {
LAB_001057c2:
      uVar4 = sprintf((char *)number_buffer,"%1.17g");
    }
    cVar7 = 0;
    if (0x19 < uVar4) goto LAB_00105823;
  }
  uVar10 = (ulong)uVar4;
  puVar6 = ensure(output_buffer,uVar10 + 1);
  cVar7 = 0;
  if (puVar6 != (uchar *)0x0) {
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      uVar9 = number_buffer[uVar8];
      if (uVar9 == uVar3) {
        uVar9 = '.';
      }
      puVar6[uVar8] = uVar9;
    }
    puVar6[uVar10] = '\0';
    output_buffer->offset = output_buffer->offset + uVar10;
    cVar7 = 1;
  }
LAB_00105823:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return cVar7;
  }
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_number(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    double d = item->valuedouble;
    int length = 0;
    size_t i = 0;
    unsigned char number_buffer[26]; /* temporary buffer to print the number into */
    unsigned char decimal_point = get_decimal_point();
    double test;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* This checks for NaN and Infinity */
    if ((d * 0) != 0)
    {
        length = sprintf((char*)number_buffer, "null");
    }
    else
    {
        /* Try 15 decimal places of precision to avoid nonsignificant nonzero digits */
        length = sprintf((char*)number_buffer, "%1.15g", d);

        /* Check whether the original double can be recovered */
        if ((sscanf((char*)number_buffer, "%lg", &test) != 1) || ((double)test != d))
        {
            /* If not, print with 17 decimal places of precision */
            length = sprintf((char*)number_buffer, "%1.17g", d);
        }
    }

    /* sprintf failed or buffer overrun occurred */
    if ((length < 0) || (length > (int)(sizeof(number_buffer) - 1)))
    {
        return false;
    }

    /* reserve appropriate space in the output */
    output_pointer = ensure(output_buffer, (size_t)length + sizeof(""));
    if (output_pointer == NULL)
    {
        return false;
    }

    /* copy the printed number to the output and replace locale
     * dependent decimal point with '.' */
    for (i = 0; i < ((size_t)length); i++)
    {
        if (number_buffer[i] == decimal_point)
        {
            output_pointer[i] = '.';
            continue;
        }

        output_pointer[i] = number_buffer[i];
    }
    output_pointer[i] = '\0';

    output_buffer->offset += (size_t)length;

    return true;
}